

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

double __thiscall HPresolve::getColumnDualPost(HPresolve *this,int col)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  
  uVar12 = (ulong)col;
  piVar3 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
  uVar13 = uVar12;
  if (uVar12 < uVar10) {
    piVar4 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
    if (uVar12 < uVar10) {
      iVar1 = piVar3[uVar12];
      uVar8 = (ulong)iVar1;
      iVar2 = piVar4[uVar12];
      dVar18 = 0.0;
      iVar7 = iVar2;
      if (iVar2 < iVar1) {
        iVar7 = iVar1;
      }
      if (iVar1 < iVar2) {
        piVar3 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar11 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
        piVar4 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
        pdVar5 = (this->super_HPreData).valueRowDual.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar14 = (long)(this->super_HPreData).valueRowDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
        pdVar6 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = (long)(this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
        uVar16 = uVar8;
        do {
          if (uVar11 <= uVar16) {
            uVar10 = uVar11;
            uVar13 = uVar8;
            if (uVar8 < uVar11) {
              uVar13 = uVar11;
            }
            goto LAB_00148ed6;
          }
          uVar17 = (ulong)piVar3[uVar16];
          uVar10 = uVar9;
          uVar13 = uVar17;
          if (uVar9 <= uVar17) goto LAB_00148ed6;
          if (piVar4[uVar17] != 0) {
            uVar10 = uVar14;
            if ((uVar14 <= uVar17) || (uVar10 = uVar15, uVar13 = uVar16, uVar15 <= uVar16))
            goto LAB_00148ed6;
            dVar18 = dVar18 + pdVar5[uVar17] * pdVar6[uVar16];
          }
          uVar16 = uVar16 + 1;
        } while ((long)iVar7 != uVar16);
      }
      pdVar5 = (this->super_HPreData).colCostAtEl.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar10 = (long)(this->super_HPreData).colCostAtEl.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
      uVar13 = uVar12;
      if (uVar12 < uVar10) {
        return dVar18 + pdVar5[uVar12];
      }
    }
  }
LAB_00148ed6:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar10);
}

Assistant:

double HPresolve::getColumnDualPost(int col) {
	int row;
	double z;
	double sum = 0;
	for (int cnt=Astart.at(col); cnt<Aend.at(col); cnt++)
		if (flagRow.at(Aindex.at(cnt))) {
			row = Aindex.at(cnt);
			sum = sum + valueRowDual.at(row)*Avalue.at(cnt);
		}
	z = sum + colCostAtEl.at(col) ;
	return z;
}